

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O2

void __thiscall
duckdb::DuckTransaction::PushDelete
          (DuckTransaction *this,DataTable *table,RowVersionManager *info,idx_t vector_idx,
          row_t *rows,idx_t count,idx_t base_row)

{
  ulong uVar1;
  long lVar2;
  unsigned_short uVar3;
  DeleteInfo *this_00;
  uint16_t *puVar4;
  ulong uVar5;
  idx_t i;
  idx_t iVar6;
  bool bVar7;
  UndoBufferReference undo_entry;
  
  ModifyTable(this,table);
  iVar6 = 0x30;
  uVar5 = 0xffffffffffffffff;
  do {
    if (uVar5 - count == -1) {
      bVar7 = true;
      goto LAB_01aeaf26;
    }
    uVar1 = uVar5 + 1;
    lVar2 = uVar5 + 1;
    uVar5 = uVar1;
  } while (uVar1 == rows[lVar2]);
  bVar7 = count <= uVar1;
  iVar6 = count * 2 + 0x30;
LAB_01aeaf26:
  UndoBuffer::CreateEntry(&undo_entry,&this->undo_buffer,DELETE_TUPLE,iVar6);
  this_00 = (DeleteInfo *)UndoBufferReference::Ptr(&undo_entry);
  this_00->version_info = info;
  this_00->vector_idx = vector_idx;
  this_00->table = table;
  this_00->count = count;
  this_00->base_row = base_row;
  this_00->is_consecutive = bVar7;
  if (bVar7 == false) {
    puVar4 = DeleteInfo::GetRows(this_00);
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      uVar3 = NumericCastImpl<unsigned_short,_long,_false>::Convert(rows[iVar6]);
      puVar4[iVar6] = uVar3;
    }
  }
  BufferHandle::~BufferHandle(&undo_entry.handle);
  return;
}

Assistant:

void DuckTransaction::PushDelete(DataTable &table, RowVersionManager &info, idx_t vector_idx, row_t rows[], idx_t count,
                                 idx_t base_row) {
	ModifyTable(table);
	bool is_consecutive = true;
	// check if the rows are consecutive
	for (idx_t i = 0; i < count; i++) {
		if (rows[i] != row_t(i)) {
			is_consecutive = false;
			break;
		}
	}
	idx_t alloc_size = sizeof(DeleteInfo);
	if (!is_consecutive) {
		// if rows are not consecutive we need to allocate row identifiers
		alloc_size += sizeof(uint16_t) * count;
	}

	auto undo_entry = undo_buffer.CreateEntry(UndoFlags::DELETE_TUPLE, alloc_size);
	auto delete_info = reinterpret_cast<DeleteInfo *>(undo_entry.Ptr());
	delete_info->version_info = &info;
	delete_info->vector_idx = vector_idx;
	delete_info->table = &table;
	delete_info->count = count;
	delete_info->base_row = base_row;
	delete_info->is_consecutive = is_consecutive;
	if (!is_consecutive) {
		// if rows are not consecutive
		auto delete_rows = delete_info->GetRows();
		for (idx_t i = 0; i < count; i++) {
			delete_rows[i] = NumericCast<uint16_t>(rows[i]);
		}
	}
}